

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,_3,_1,_0,_3,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
_set_noalias<Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::SingleRange,int_const(&)[3]>>
          (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *this,
          DenseBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>_>
          *other)

{
  Matrix<double,_3,_1,_0,_3,_1> *pMVar1;
  IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>
  *src;
  assign_op<double,_double> local_19;
  EigenBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>_>
  *local_18;
  DenseBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>_>
  *other_local;
  PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_local;
  
  local_18 = (EigenBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>_>
              *)other;
  other_local = (DenseBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>_>
                 *)this;
  pMVar1 = EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this);
  src = EigenBase<Eigen::IndexedView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>_>
        ::derived(local_18);
  internal::assign_op<double,_double>::assign_op(&local_19);
  internal::
  call_assignment_no_alias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::SingleRange,int_const(&)[3]>,Eigen::internal::assign_op<double,double>>
            (pMVar1,src,&local_19);
  pMVar1 = EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }